

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::SetPhiInDegrees(LE_EulerAngles *this,KFIXED8_3 *Phi)

{
  KFIXED<char,_(unsigned_char)__x03_> KStack_38;
  DataTypeBase local_28;
  char local_20;
  KFIXED<char,_(unsigned_char)__x03_> local_18;
  
  local_28._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_002214d0;
  local_20 = Phi->m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&KStack_38,0.017453292519943295);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_18,&this->m_Phi);
  DataTypeBase::~DataTypeBase(&local_18.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&KStack_38.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_28);
  return;
}

Assistant:

void LE_EulerAngles::SetPhiInDegrees( KFIXED8_3 Phi )
{
    m_Phi = DegToRad( Phi );
}